

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

char * el::base::utils::DateTime::parseFormat
                 (char *buf,size_t bufSz,char *format,tm *tInfo,size_t msec,
                 MillisecondsWidth *msWidth)

{
  char cVar1;
  long lVar2;
  undefined1 *puVar3;
  char *pcVar4;
  int len;
  char *pcVar5;
  size_t n;
  char *bufLim;
  
  bufLim = buf + bufSz;
  do {
    if (*format != '%') {
      pcVar5 = format;
      if (*format != '\0') {
LAB_0011dd8a:
        if (buf != bufLim) {
          *buf = *pcVar5;
          buf = buf + 1;
          pcVar4 = pcVar5;
          goto switchD_0011de12_caseD_43;
        }
      }
      return buf;
    }
    pcVar4 = format + 1;
    cVar1 = format[1];
    switch(cVar1) {
    case 'a':
      lVar2 = (long)tInfo->tm_wday;
      puVar3 = _ZN2el4base6constsL11kDaysAbbrevE_rel;
      break;
    case 'b':
      lVar2 = (long)tInfo->tm_mon;
      puVar3 = _ZN2el4base6constsL13kMonthsAbbrevE_rel;
      break;
    case 'c':
    case 'e':
    case 'f':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
      goto switchD_0011de12_caseD_43;
    case 'd':
      n = (size_t)tInfo->tm_mday;
      goto LAB_0011dec6;
    case 'g':
switchD_0011ddfc_caseD_67:
      len = msWidth->m_width;
      n = msec;
      goto LAB_0011dec9;
    case 'h':
      n = (size_t)(tInfo->tm_hour % 0xc);
      goto LAB_0011dec6;
    case 'm':
      n = (size_t)tInfo->tm_min;
LAB_0011dec6:
      len = 2;
LAB_0011dec9:
      buf = Str::convertAndAddToBuff(n,len,buf,bufLim,true);
      goto switchD_0011de12_caseD_43;
    default:
      switch(cVar1) {
      case 'A':
        lVar2 = (long)tInfo->tm_wday;
        puVar3 = _ZN2el4base6constsL5kDaysE_rel;
        break;
      case 'B':
        lVar2 = (long)tInfo->tm_mon;
        puVar3 = _ZN2el4base6constsL7kMonthsE_rel;
        break;
      case 'C':
      case 'D':
      case 'E':
      case 'G':
        goto switchD_0011de12_caseD_43;
      case 'F':
        pcVar5 = "AM";
        if (0xb < tInfo->tm_hour) {
          pcVar5 = "PM";
        }
        goto LAB_0011de78;
      case 'H':
        n = (size_t)tInfo->tm_hour;
        goto LAB_0011dec6;
      default:
        if (cVar1 == 'z') goto switchD_0011ddfc_caseD_67;
        pcVar5 = pcVar4;
        if (cVar1 == '%') goto LAB_0011dd8a;
        if (cVar1 == 'M') {
          n = (long)tInfo->tm_mon + 1;
        }
        else {
          if (cVar1 == 'Y') {
            n = (long)tInfo->tm_year + 0x76c;
            len = 4;
            goto LAB_0011dec9;
          }
          if (cVar1 == 's') {
            n = (size_t)tInfo->tm_sec;
          }
          else {
            if (cVar1 != 'y') {
              pcVar5 = format;
              if (cVar1 != '\0') goto switchD_0011de12_caseD_43;
              goto LAB_0011dd8a;
            }
            n = (long)tInfo->tm_year + 0x76c;
          }
        }
        goto LAB_0011dec6;
      }
    }
    pcVar5 = puVar3 + *(int *)(puVar3 + lVar2 * 4);
LAB_0011de78:
    buf = Str::addToBuff(pcVar5,buf,bufLim);
switchD_0011de12_caseD_43:
    format = pcVar4 + 1;
  } while( true );
}

Assistant:

static char* parseFormat(char* buf, std::size_t bufSz, const char* format, const struct tm* tInfo,
            std::size_t msec, const base::MillisecondsWidth* msWidth) {
        const char* bufLim = buf + bufSz;
        for (; *format; ++format) {
            if (*format == base::consts::kFormatSpecifierChar) {
                switch (*++format) {
                case base::consts::kFormatSpecifierChar:  // Escape
                    break;
                case '\0':  // End
                    --format;
                    break;
                case 'd':  // Day
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_mday, 2, buf, bufLim);
                    continue;
                case 'a':  // Day of week (short)
                    buf = base::utils::Str::addToBuff(base::consts::kDaysAbbrev[tInfo->tm_wday], buf, bufLim);
                    continue;
                case 'A':  // Day of week (long)
                    buf = base::utils::Str::addToBuff(base::consts::kDays[tInfo->tm_wday], buf, bufLim);
                    continue;
                case 'M':  // month
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_mon + 1, 2, buf, bufLim);
                    continue;
                case 'b':  // month (short)
                    buf = base::utils::Str::addToBuff(base::consts::kMonthsAbbrev[tInfo->tm_mon], buf, bufLim);
                    continue;
                case 'B':  // month (long)
                    buf = base::utils::Str::addToBuff(base::consts::kMonths[tInfo->tm_mon], buf, bufLim);
                    continue;
                case 'y':  // year (two digits)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_year + base::consts::kYearBase, 2, buf, bufLim);
                    continue;
                case 'Y':  // year (four digits)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_year + base::consts::kYearBase, 4, buf, bufLim);
                    continue;
                case 'h':  // hour (12-hour)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_hour % 12, 2, buf, bufLim);
                    continue;
                case 'H':  // hour (24-hour)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_hour, 2, buf, bufLim);
                    continue;
                case 'm':  // minute
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_min, 2, buf, bufLim);
                    continue;
                case 's':  // second
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_sec, 2, buf, bufLim);
                    continue;
                case 'z':  // milliseconds
                case 'g':
                    buf = base::utils::Str::convertAndAddToBuff(msec, msWidth->m_width, buf, bufLim);
                    continue;
                case 'F':  // AM/PM
                    buf = base::utils::Str::addToBuff((tInfo->tm_hour >= 12) ? base::consts::kPm : base::consts::kAm, buf, bufLim);
                    continue;
                default:
                    continue;
                }
            }
            if (buf == bufLim) break;
            *buf++ = *format;
        }
        return buf;
    }